

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

index_t __thiscall xLearn::FromDMReader::Samples(FromDMReader *this,DMatrix **matrix)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  DMatrix *pDVar10;
  long lVar11;
  
  uVar6 = this->num_samples_;
  if ((ulong)uVar6 != 0) {
    uVar1 = this->pos_;
    uVar7 = (ulong)uVar1;
    pDVar10 = this->data_ptr_;
    uVar8 = 0;
    do {
      if ((ulong)pDVar10->row_length <= uVar7 + uVar8) {
        if (uVar8 == 0) {
          if ((this->super_Reader).shuffle_ == true) {
            srand((this->super_Reader).seed_ + 1);
            puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar4 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((puVar3 != puVar4) && (puVar3 + 1 != puVar4)) {
              lVar11 = 4;
              do {
                iVar5 = rand();
                lVar9 = (long)iVar5 % ((lVar11 >> 2) + 1);
                if (lVar11 != lVar9 * 4) {
                  uVar6 = *(uint *)((long)puVar3 + lVar11);
                  *(uint *)((long)puVar3 + lVar11) = puVar3[lVar9];
                  puVar3[lVar9] = uVar6;
                }
                lVar9 = lVar11 + 4;
                lVar11 = lVar11 + 4;
                uVar6 = 0;
                pDVar10 = (DMatrix *)0x0;
              } while ((pointer)((long)puVar3 + lVar9) != puVar4);
              goto LAB_0013befd;
            }
          }
          pDVar10 = (DMatrix *)0x0;
          uVar6 = 0;
          goto LAB_0013befd;
        }
        break;
      }
      (this->super_Reader).data_samples_.row.
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar8] =
           (pDVar10->row).
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7 + uVar8]];
      pDVar10 = this->data_ptr_;
      uVar2 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar7 + uVar8];
      (this->super_Reader).data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl
      .super__Vector_impl_data._M_start[uVar8] =
           (pDVar10->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      iVar5 = (int)uVar8;
      (this->super_Reader).data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar8] =
           (pDVar10->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      uVar8 = uVar8 + 1;
      this->pos_ = uVar1 + 1 + iVar5;
    } while (uVar6 != uVar8);
  }
  pDVar10 = &(this->super_Reader).data_samples_;
LAB_0013befd:
  *matrix = pDVar10;
  return uVar6;
}

Assistant:

index_t FromDMReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= this->data_ptr_->row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = this->data_ptr_->row[order_[pos_]];
    data_samples_.Y[i] = this->data_ptr_->Y[order_[pos_]];
    data_samples_.norm[i] = this->data_ptr_->norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}